

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  allocator local_1c1;
  string local_1c0 [32];
  text local_1a0;
  byte local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  byte local_154;
  byte local_153;
  byte local_152;
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  text local_d0;
  location local_b0;
  allocator local_71;
  string local_70 [32];
  text local_50;
  byte local_29;
  text *ptStack_28;
  bool zen_local;
  text *decomposition__local;
  text *expr__local;
  location *where__local;
  passing *this_local;
  
  local_29 = zen;
  ptStack_28 = decomposition_;
  decomposition__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"passed",&local_71);
  std::__cxx11::string::string((string *)&local_50,local_70);
  location::location(&local_b0,where_);
  local_152 = 0;
  local_153 = 0;
  local_154 = 0;
  local_179 = 0;
  if ((local_29 & 1) == 0) {
    std::operator+(&local_178," for ",decomposition_);
    local_179 = 1;
    std::__cxx11::string::string((string *)&local_110,(string *)&local_178);
  }
  else {
    std::allocator<char>::allocator();
    local_152 = 1;
    std::__cxx11::string::string(local_150,"",&local_151);
    local_153 = 1;
    std::__cxx11::string::string(local_130,local_150);
    local_154 = 1;
    std::__cxx11::string::string((string *)&local_110,local_130);
  }
  std::operator+(&local_f0,expr_,&local_110);
  std::__cxx11::string::string((string *)&local_d0,(string *)&local_f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"",&local_1c1);
  std::__cxx11::string::string((string *)&local_1a0,local_1c0);
  success::success(&this->super_success,&local_50,&local_b0,&local_d0,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  if ((local_179 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_178);
  }
  if ((local_154 & 1) != 0) {
    std::__cxx11::string::~string(local_130);
  }
  if ((local_153 & 1) != 0) {
    std::__cxx11::string::~string(local_150);
  }
  if ((local_152 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
  }
  location::~location(&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  *(undefined ***)&(this->super_success).super_message = &PTR__passing_001ebbc0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}